

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

void apply_complex_filter(equippable_filter *f,equippable_summary *s)

{
  wchar_t wVar1;
  equippable_expr *peVar2;
  char cVar3;
  char *p;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long local_40;
  
  if ((long)f->nv < 1) {
    __assert_fail("f->nv > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                  ,0x6eb,
                  "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                 );
  }
  p = (char *)mem_alloc((long)f->nv);
  s->nfilt = L'\0';
  if (s->nitems < L'\x01') {
LAB_001e7dee:
    s->sorted_indices[s->nfilt] = -1;
    mem_free(p);
    return;
  }
  local_40 = 0;
  uVar6 = 0;
LAB_001e7cc2:
  uVar4 = (ulong)(uint)f->nv;
  if (f->nv < L'\0') {
LAB_001e7e16:
    __assert_fail("j <= f->nv",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                  ,0x6f3,
                  "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                 );
  }
  lVar7 = -1;
  lVar5 = 8;
  do {
    peVar2 = f->v;
    switch(*(undefined4 *)((long)&(peVar2->s).ex + lVar5)) {
    case 0:
      if ((int)uVar4 <= (int)uVar6) {
        __assert_fail("nst < f->nv",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x702,
                      "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      cVar3 = (**(code **)((long)peVar2 + lVar5 + -8))
                        (s->items + local_40,(long)&(peVar2->s).func + lVar5);
      p[(int)uVar6] = cVar3;
      uVar6 = uVar6 + 1;
      break;
    case 1:
      if ((int)uVar6 < 2) {
        __assert_fail("nst >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x709,
                      "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      if (p[(ulong)uVar6 - 1] == '\x01') {
        cVar3 = p[(ulong)uVar6 - 2];
      }
      else {
        cVar3 = '\0';
      }
      p[(ulong)uVar6 - 2] = cVar3;
      goto LAB_001e7d6e;
    case 2:
      if ((int)uVar6 < 2) {
        __assert_fail("nst >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x710,
                      "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      cVar3 = '\x01';
      if (p[(ulong)uVar6 - 1] == '\0') {
        cVar3 = p[(ulong)uVar6 - 2];
      }
      p[(ulong)uVar6 - 2] = cVar3;
LAB_001e7d6e:
      uVar6 = uVar6 - 1;
      break;
    case 3:
      goto switchD_001e7cf9_caseD_3;
    }
    uVar4 = (ulong)f->nv;
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0x18;
    if ((long)uVar4 <= lVar7) goto LAB_001e7e16;
  } while( true );
switchD_001e7cf9_caseD_3:
  if (uVar6 != 1) {
    __assert_fail("nst == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                  ,0x6f6,
                  "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                 );
  }
  if (*p == '\x01') {
    wVar1 = s->nfilt;
    if ((s->nitems <= wVar1) || (s->nalloc <= wVar1)) {
      __assert_fail("s->nfilt < s->nitems && s->nfilt < s->nalloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                    ,0x6f9,
                    "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                   );
    }
    s->sorted_indices[wVar1] = (int)local_40;
    s->nfilt = s->nfilt + L'\x01';
  }
  local_40 = local_40 + 1;
  uVar6 = 1;
  if (s->nitems <= local_40) goto LAB_001e7dee;
  goto LAB_001e7cc2;
}

Assistant:

static void apply_complex_filter(const struct equippable_filter *f,
	struct equippable_summary *s)
{
	bool *stack;
	int nst, i;

	assert(f->nv > 0);
	stack = mem_alloc(f->nv * sizeof(*stack));
	nst = 0;
	s->nfilt = 0;
	for (i = 0; i < s->nitems; ++i) {
		int j = 0;

		while (1) {
			assert(j <= f->nv);

			if (f->v[j].c == EQUIP_EXPR_TERMINATOR) {
				assert(nst == 1);
				if (stack[0]) {
					assert(s->nfilt < s->nitems &&
						s->nfilt < s->nalloc);
					s->sorted_indices[s->nfilt] = i;
					++s->nfilt;
				}
				break;
			}

			switch (f->v[j].c) {
			case EQUIP_EXPR_SELECTOR:
				assert(nst < f->nv);
				stack[nst] = (*f->v[j].s.func)(s->items + i,
					&f->v[j].s.ex);
				++nst;
				break;

			case EQUIP_EXPR_AND:
				assert(nst >= 2);
				stack[nst - 2] =
					(stack[nst - 1] && stack[nst - 2]);
				--nst;
				break;

			case EQUIP_EXPR_OR:
				assert(nst >= 2);
				stack[nst - 2] =
					(stack[nst - 1] || stack[nst - 2]);
				--nst;
				break;

			case EQUIP_EXPR_TERMINATOR:
				assert(0);
			}
			++j;
		}
	}

	s->sorted_indices[s->nfilt] = -1;

	mem_free(stack);
}